

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ems_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  uint uVar1;
  SSL *ssl_00;
  bool bVar2;
  uint16_t uVar3;
  size_t sVar4;
  pointer psVar5;
  SSL *ssl;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if (contents != (CBS *)0x0) {
    uVar3 = ssl_protocol_version(ssl_00);
    if ((0x303 < uVar3) || (sVar4 = CBS_len(contents), sVar4 != 0)) {
      return false;
    }
    *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xfffdffff | 0x20000;
  }
  bVar2 = std::operator!=(&ssl_00->s3->established_session,(nullptr_t)0x0);
  if ((bVar2) &&
     (uVar1 = *(uint *)&hs->field_0x6c8,
     psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                        (&ssl_00->s3->established_session),
     (uVar1 >> 0x11 & 1) != (uint)(psVar5->field_0x1b8 & 1))) {
    ERR_put_error(0x10,0,0x107,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x366);
    *out_alert = '/';
    hs_local._7_1_ = false;
  }
  else {
    hs_local._7_1_ = true;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ems_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  SSL *const ssl = hs->ssl;

  if (contents != NULL) {
    if (ssl_protocol_version(ssl) >= TLS1_3_VERSION ||  //
        CBS_len(contents) != 0) {
      return false;
    }

    hs->extended_master_secret = true;
  }

  // Whether EMS is negotiated may not change on renegotiation.
  if (ssl->s3->established_session != nullptr &&
      hs->extended_master_secret !=
          !!ssl->s3->established_session->extended_master_secret) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_EMS_MISMATCH);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  return true;
}